

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase62::run(TestCase62 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  Orphan<capnproto_test::capnp::test::TestEmptyStruct> *orphan_00;
  MessageSize MVar2;
  bool local_1d9;
  uint64_t uStack_1d8;
  bool _kj_shouldLog_2;
  uint local_1d0;
  int local_1c8;
  bool local_1c1;
  uint64_t uStack_1c0;
  bool _kj_shouldLog_1;
  uint local_1b8;
  Orphanage local_1b0;
  undefined1 local_1a0 [8];
  Orphan<capnproto_test::capnp::test::TestEmptyStruct> orphan;
  bool local_151;
  undefined1 local_150 [7];
  bool _kj_shouldLog;
  Builder anyPointer;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase62 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_150,(Builder *)local_128);
  bVar1 = AnyPointer::Builder::isNull((Builder *)local_150);
  if (!bVar1) {
    local_151 = kj::_::Debug::shouldLog(ERROR);
    while (local_151 != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x42,ERROR,"\"failed: expected \" \"anyPointer.isNull()\"",
                 (char (*) [37])"failed: expected anyPointer.isNull()");
      local_151 = false;
    }
  }
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestAllTypes>
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)&orphan.builder.location,
             (Builder *)local_150);
  local_1b0 = MessageBuilder::getOrphanage((MessageBuilder *)&root._builder.dataSize);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestEmptyStruct>
            ((Orphan<capnproto_test::capnp::test::TestEmptyStruct> *)local_1a0,&local_1b0);
  orphan_00 = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestEmptyStruct>>
                        ((Orphan<capnproto_test::capnp::test::TestEmptyStruct> *)local_1a0);
  AnyPointer::Builder::adopt<capnproto_test::capnp::test::TestEmptyStruct>
            ((Builder *)local_150,orphan_00);
  MVar2 = AnyPointer::Builder::targetSize((Builder *)local_150);
  uStack_1c0 = MVar2.wordCount;
  local_1b8 = MVar2.capCount;
  if (uStack_1c0 != 0) {
    local_1c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c1 != false) {
      local_1c8 = 0;
      MVar2 = AnyPointer::Builder::targetSize((Builder *)local_150);
      uStack_1d8 = MVar2.wordCount;
      local_1d0 = MVar2.capCount;
      kj::_::Debug::log<char_const(&)[60],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x46,ERROR,
                 "\"failed: expected \" \"(0) == (anyPointer.targetSize().wordCount)\", 0, anyPointer.targetSize().wordCount"
                 ,(char (*) [60])"failed: expected (0) == (anyPointer.targetSize().wordCount)",
                 &local_1c8,&stack0xfffffffffffffe28);
      local_1c1 = false;
    }
  }
  bVar1 = AnyPointer::Builder::isNull((Builder *)local_150);
  if (bVar1) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      kj::_::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x47,ERROR,"\"failed: expected \" \"!(anyPointer.isNull())\"",
                 (char (*) [40])"failed: expected !(anyPointer.isNull())");
      local_1d9 = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestEmptyStruct>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestEmptyStruct> *)local_1a0);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, EmptyStructOverwrite) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();
  auto anyPointer = root.getAnyPointerField();
  EXPECT_TRUE(anyPointer.isNull());
  anyPointer.initAs<TestAllTypes>();
  auto orphan = builder.getOrphanage().newOrphan<test::TestEmptyStruct>();
  anyPointer.adopt(kj::mv(orphan));
  EXPECT_EQ(0, anyPointer.targetSize().wordCount);
  EXPECT_FALSE(anyPointer.isNull());
}